

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

real __thiscall fasttext::Model::negativeSampling(Model *this,int32_t target,real lr)

{
  pointer piVar1;
  bool bVar2;
  ulong uVar3;
  int target_00;
  int iVar4;
  real rVar5;
  float fVar6;
  
  Vector::zero(&this->grad_);
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->neg < 0
     ) {
    fVar6 = 0.0;
  }
  else {
    fVar6 = 0.0;
    iVar4 = 0;
    do {
      if (iVar4 == 0) {
        bVar2 = true;
        target_00 = target;
      }
      else {
        piVar1 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = this->negpos;
        do {
          target_00 = piVar1[uVar3];
          uVar3 = (uVar3 + 1) %
                  (ulong)((long)(this->negatives_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        } while (target_00 == target);
        this->negpos = uVar3;
        bVar2 = false;
      }
      rVar5 = binaryLogistic(this,target_00,bVar2,lr);
      fVar6 = fVar6 + rVar5;
      bVar2 = iVar4 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->neg;
      iVar4 = iVar4 + 1;
    } while (bVar2);
  }
  return fVar6;
}

Assistant:

real Model::negativeSampling(int32_t target, real lr) {
  real loss = 0.0;
  grad_.zero();
  for (int32_t n = 0; n <= args_->neg; n++) {
    if (n == 0) {
      loss += binaryLogistic(target, true, lr);
    } else {
      loss += binaryLogistic(getNegative(target), false, lr);
    }
  }
  return loss;
}